

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void dist_single_run<double,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>,std::uniform_real_distribution<double>>
               (uniform_real_distribution<double> *dist,
               linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *generator,
               size_t times)

{
  ostream *this;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_RDX;
  result_type_conflict1 rVar1;
  size_t i;
  double total;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *__urng;
  uniform_real_distribution<double> *this_00;
  
  this_00 = (uniform_real_distribution<double> *)0x0;
  for (__urng = (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)0x0;
      __urng < in_RDX;
      __urng = (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
               ((long)&__urng->_M_x + 1)) {
    rVar1 = std::uniform_real_distribution<double>::operator()(this_00,__urng);
    this_00 = (uniform_real_distribution<double> *)(rVar1 + (double)this_00);
  }
  if (((double)this_00 == 0.0) && (!NAN((double)this_00))) {
    this = std::operator<<((ostream *)&std::cout,"This is to avoid compiler optimizations.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void dist_single_run (D& dist, G& generator, size_t times ) {
    Real total = 0.0;

    for ( size_t i = 0; i < times; ++i )
        total += dist(generator);

    if ( total == 0 ) cout << "This is to avoid compiler optimizations." << endl;
}